

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void traverse_hplane<PredictionData<float,int>,int,ImputedData<int,double>>
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane,ExtIsoForest *model_outputs,
               PredictionData<float,_int> *prediction_data,double *output_depth,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes,
               ImputedData<int,_double> *imputed_data,int *tree_num,double *tree_depth,size_t row)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  double *in_RCX;
  int iVar11;
  long *in_RDX;
  long in_RSI;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_RDI;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_R8;
  long in_R9;
  char cVar12;
  double dVar13;
  long in_stack_00000008;
  double *in_stack_00000010;
  ImputeNode *in_stack_00000018;
  size_t col;
  size_t ub;
  size_t lb;
  int *row_end;
  int *row_st;
  NumericConfig numeric_config;
  size_t ncols_categ;
  size_t ncols_numeric;
  double hval;
  int cval;
  double xval;
  size_t curr_lev;
  size_t local_158;
  double in_stack_fffffffffffffeb8;
  double in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  ImputeNode *in_stack_fffffffffffffee8;
  pointer *local_110;
  byte local_e9;
  double in_stack_ffffffffffffff30;
  ImputedData<int,_double> *in_stack_ffffffffffffff38;
  ImputeNode *in_stack_ffffffffffffff40;
  ulong local_90;
  ImputedData<int,_double> *local_78;
  double local_70;
  size_type local_60;
  size_type local_58;
  double local_50;
  double local_40;
  size_type local_38;
  
  local_38 = 0;
  if (in_RDX[0xb] == 0) {
    if (in_RDX[8] == 0) {
      cVar12 = (*(byte *)(in_RDX + 3) & 1) != 0;
    }
    else {
      cVar12 = '\x03';
    }
  }
  else {
    cVar12 = '\x02';
  }
  local_70 = 0.0;
  local_78 = (ImputedData<int,_double> *)0x0;
  if (cVar12 == '\x02') {
    local_70 = (double)(in_RDX[10] + (long)*(int *)(in_RDX[0xb] + (long)in_stack_00000018 * 4) * 4);
    local_78 = (ImputedData<int,_double> *)
               (in_RDX[10] + (long)*(int *)(in_RDX[0xb] + 4 + (long)in_stack_00000018 * 4) * 4);
  }
  do {
    pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    if (pvVar4->hplane_left == 0) {
      pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      *in_RCX = pvVar4->score + *in_RCX;
      if (in_stack_00000008 != 0) {
        *(int *)(in_stack_00000008 + (long)in_stack_00000018 * 4) = (int)local_38;
      }
      if (in_stack_00000010 != (double *)0x0) {
        pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
        *in_stack_00000010 = pvVar4->score;
      }
      if (in_R9 != 0) {
        std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[](in_R8,local_38);
        add_from_impute_node<ImputedData<int,double>>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      }
      return;
    }
    local_50 = 0.0;
    local_58 = 0;
    local_60 = 0;
    local_90 = 0;
    while( true ) {
      pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar4->col_num);
      if (sVar5 <= local_90) break;
      pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      pvVar6 = std::vector<ColType,_std::allocator<ColType>_>::operator[]
                         (&pvVar4->col_type,local_90);
      if (*pvVar6 == Numeric) {
        switch(cVar12) {
        case '\0':
          lVar1 = *in_RDX;
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&pvVar4->col_num,local_90);
          local_40 = (double)*(float *)(lVar1 + (*pvVar7 + (long)in_stack_00000018 * in_RDX[4]) * 4)
          ;
          break;
        case '\x01':
          lVar1 = *in_RDX;
          in_stack_ffffffffffffff40 = in_stack_00000018;
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&pvVar4->col_num,local_90);
          local_40 = (double)*(float *)(lVar1 + (long)((long)&(in_stack_ffffffffffffff40->num_sum).
                                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  *pvVar7 * in_RDX[2]) * 4);
          break;
        case '\x02':
          in_stack_ffffffffffffff30 = local_70;
          in_stack_ffffffffffffff38 = local_78;
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&pvVar4->col_num,local_90);
          local_40 = extract_spR<PredictionData<float,int>,int>
                               ((PredictionData<float,_int> *)in_stack_fffffffffffffee8,
                                (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                                ,in_stack_fffffffffffffed8,
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                                (size_t)in_stack_fffffffffffffec0);
          break;
        case '\x03':
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&pvVar4->col_num,local_90);
          local_40 = extract_spC<PredictionData<float,int>>
                               ((PredictionData<float,_int> *)
                                CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                                (size_t)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8)
          ;
        }
        uVar2 = std::isnan(local_40);
        local_e9 = 1;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf(local_40);
          local_e9 = (byte)iVar3;
        }
        if ((local_e9 & 1) == 0) {
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&pvVar4->mean,local_58);
          dVar13 = *pvVar8;
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&pvVar4->coef,local_58);
          dVar13 = (local_40 - dVar13) * *pvVar8;
        }
        else {
          if (*(int *)(in_RSI + 0x20) == 0) {
            *in_RCX = NAN;
            return;
          }
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar4->fill_val,local_90);
          dVar13 = *pvVar8;
        }
        local_50 = dVar13 + local_50;
        local_58 = local_58 + 1;
      }
      else if (*pvVar6 == Categorical) {
        lVar1 = in_RDX[1];
        if ((*(byte *)(in_RDX + 3) & 1) == 0) {
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&pvVar4->col_num,local_90);
          local_110 = (pointer *)(*pvVar7 + (long)in_stack_00000018 * in_RDX[5]);
        }
        else {
          in_stack_fffffffffffffee8 = in_stack_00000018;
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&pvVar4->col_num,local_90);
          local_110 = (pointer *)
                      ((long)&(in_stack_fffffffffffffee8->num_sum).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + *pvVar7 * in_RDX[2]);
        }
        iVar3 = *(int *)(lVar1 + (long)local_110 * 4);
        if (iVar3 < 0) {
          if (*(int *)(in_RSI + 0x20) == 0) {
            *in_RCX = NAN;
            return;
          }
          pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar4->fill_val,local_90);
          local_50 = *pvVar8 + local_50;
        }
        else {
          in_stack_fffffffffffffee4 = *(int *)(in_RSI + 0x1c);
          if (in_stack_fffffffffffffee4 == 0) {
            in_stack_fffffffffffffed4 = iVar3;
            pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38)
            ;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&pvVar4->cat_coef,local_60);
            sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar10);
            if (in_stack_fffffffffffffed4 < (int)sVar5) {
              pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 (in_RDI,local_38);
              pvVar10 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&pvVar4->cat_coef,local_60);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,(long)iVar3)
              ;
              dVar13 = *pvVar8;
            }
            else if (*(int *)(in_RSI + 0x18) == 0xc) {
              pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 (in_RDI,local_38);
              pvVar10 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&pvVar4->cat_coef,local_60);
              sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar10);
              iVar11 = iVar3 % (int)sVar5;
              pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 (in_RDI,local_38);
              pvVar10 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&pvVar4->cat_coef,local_60);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar10,(long)iVar11);
              dVar13 = *pvVar8;
              in_stack_fffffffffffffed0 = iVar3;
            }
            else {
              pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 (in_RDI,local_38);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&pvVar4->fill_new,local_60);
              dVar13 = *pvVar8;
            }
            local_50 = dVar13 + local_50;
          }
          else if (in_stack_fffffffffffffee4 == 0x29) {
            pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38)
            ;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&pvVar4->chosen_cat,local_60);
            if (iVar3 == *pvVar9) {
              pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 (in_RDI,local_38);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&pvVar4->fill_new,local_60);
              in_stack_fffffffffffffed8 = (int *)*pvVar8;
            }
            else {
              in_stack_fffffffffffffed8 = (int *)0x0;
            }
            local_50 = (double)in_stack_fffffffffffffed8 + local_50;
            in_stack_fffffffffffffee0 = iVar3;
          }
        }
        local_60 = local_60 + 1;
      }
      local_90 = local_90 + 1;
    }
    in_stack_fffffffffffffec0 = local_50;
    pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    in_stack_fffffffffffffecf = true;
    if (pvVar4->range_low <= in_stack_fffffffffffffec0) {
      in_stack_fffffffffffffeb8 = local_50;
      pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      in_stack_fffffffffffffecf =
           pvVar4->range_high <= in_stack_fffffffffffffeb8 &&
           in_stack_fffffffffffffeb8 != pvVar4->range_high;
    }
    *in_RCX = *in_RCX - (double)(byte)in_stack_fffffffffffffecf;
    pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    if (pvVar4->split_point < local_50) {
      pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      local_158 = pvVar4->hplane_right;
    }
    else {
      pvVar4 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      local_158 = pvVar4->hplane_left;
    }
    local_38 = local_158;
  } while( true );
}

Assistant:

void traverse_hplane(std::vector<IsoHPlane>   &hplane,
                     ExtIsoForest             &model_outputs,
                     PredictionData           &prediction_data,
                     double &restrict         output_depth,
                     std::vector<ImputeNode> *impute_nodes,     /* only when imputing missing */
                     ImputedData             *imputed_data,     /* only when imputing missing */
                     sparse_ix *restrict      tree_num,
                     double *restrict         tree_depth,
                     size_t                   row) noexcept
{
    size_t  curr_lev = 0;
    double  xval;
    int     cval;
    double  hval;

    size_t ncols_numeric, ncols_categ;

    NumericConfig numeric_config;
    if (prediction_data.Xr_indptr != NULL)
        numeric_config = SparseCSR;
    else if (prediction_data.Xc_indptr != NULL)
        numeric_config = SparseCSC;
    else if (prediction_data.is_col_major)
        numeric_config = DenseColMajor;
    else
        numeric_config = DenseRowMajor;

    sparse_ix *row_st = NULL, *row_end = NULL;
    size_t lb, ub;
    if (numeric_config == SparseCSR)
    {
        row_st  = prediction_data.Xr_ind + prediction_data.Xr_indptr[row];
        row_end = prediction_data.Xr_ind + prediction_data.Xr_indptr[row + 1];
        lb = *row_st;
        ub = *(row_end-1);
    }

    while (true)
    {
        // if (hplane[curr_lev].score > 0)
        if (unlikely(hplane[curr_lev].hplane_left == 0))
        {
            output_depth += hplane[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = hplane[curr_lev].score;
            if (unlikely(imputed_data != NULL))
            {
                add_from_impute_node((*impute_nodes)[curr_lev], *imputed_data, (double)1);
            }
            return;
        }

        else
        {
            hval = 0;
            ncols_numeric = 0; ncols_categ = 0;
            for (size_t col = 0; col < hplane[curr_lev].col_num.size(); col++)
            {
                switch(hplane[curr_lev].col_type[col])
                {
                    case Numeric:
                    {
                        switch(numeric_config)
                        {
                            case DenseRowMajor:
                            {
                                xval = prediction_data.numeric_data[hplane[curr_lev].col_num[col] + row * prediction_data.ncols_numeric];
                                break;
                            }

                            case DenseColMajor:
                            {
                                xval = prediction_data.numeric_data[row +  hplane[curr_lev].col_num[col] * prediction_data.nrows];
                                break;
                            }

                            case SparseCSR:
                            {
                                xval = extract_spR(prediction_data, row_st, row_end, hplane[curr_lev].col_num[col], lb, ub);
                                break;
                            }

                            case SparseCSC:
                            {
                                xval = extract_spC(prediction_data, row, hplane[curr_lev].col_num[col]);
                                break;
                            }
                        }

                        if (unlikely(is_na_or_inf(xval)))
                        {
                            if (model_outputs.missing_action != Fail)
                            {
                                hval += hplane[curr_lev].fill_val[col];
                            }

                            else
                            {
                                output_depth = NAN;
                                return;
                            }
                        }

                        else
                        {
                            hval += (xval - hplane[curr_lev].mean[ncols_numeric]) * hplane[curr_lev].coef[ncols_numeric];
                        }

                        ncols_numeric++;
                        break;
                    }

                    case Categorical:
                    {
                        cval = prediction_data.categ_data[
                            prediction_data.is_col_major?
                            (row +  hplane[curr_lev].col_num[col] * prediction_data.nrows)
                                :
                            (hplane[curr_lev].col_num[col] + row * prediction_data.ncols_categ)
                        ];
                        if (unlikely(cval < 0))
                        {
                            if (model_outputs.missing_action != Fail)
                            {
                                hval += hplane[curr_lev].fill_val[col];
                            }
                            
                            else
                            {
                                output_depth = NAN;
                                return;
                            }
                        }

                        else
                        {
                            switch(model_outputs.cat_split_type)
                            {
                                case SingleCateg:
                                {
                                    hval += (cval == hplane[curr_lev].chosen_cat[ncols_categ])? hplane[curr_lev].fill_new[ncols_categ] : 0;
                                    break;
                                }

                                case SubSet:
                                {
                                    if (unlikely(cval >= (int)hplane[curr_lev].cat_coef[ncols_categ].size()))
                                    {
                                        if (model_outputs.new_cat_action == Random) {
                                            cval = cval % (int)hplane[curr_lev].cat_coef[ncols_categ].size();
                                            hval += hplane[curr_lev].cat_coef[ncols_categ][cval];
                                        }

                                        else {
                                            hval += hplane[curr_lev].fill_new[ncols_categ];
                                        }
                                    }
                                    
                                    else
                                    {
                                        hval += hplane[curr_lev].cat_coef[ncols_categ][cval];
                                    }
                                    
                                    break;
                                }
                            }
                        }

                        ncols_categ++;
                        break;
                    }

                    default:
                    {
                        assert(0);
                        break;
                    }
                }

            }

            output_depth -= (hval < hplane[curr_lev].range_low) ||
                            (hval > hplane[curr_lev].range_high);
            curr_lev       = (hval <= hplane[curr_lev].split_point)?
                             hplane[curr_lev].hplane_left : hplane[curr_lev].hplane_right;
        }
    }
}